

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_set_operation.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalSetOperation *setop,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  char cVar1;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var2;
  undefined8 uVar3;
  reference pvVar4;
  pointer pLVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  pointer this_01;
  type other;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_02;
  type new_stats_00;
  InternalException *this_03;
  StatisticsPropagator *this_04;
  element_type *__n;
  pointer *this_05;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> new_stats;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> left_stats;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> right_stats;
  ColumnBinding binding;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  vector<duckdb::ColumnBinding,_true> left_bindings;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [40];
  undefined1 local_60 [48];
  
  this_00 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             *)(node_ptr + 2);
  local_88._32_8_ = this;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[](this_00,0);
  PropagateStatistics((StatisticsPropagator *)local_98,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)setop);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[](this_00,1);
  PropagateStatistics((StatisticsPropagator *)(local_98 + 8),
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)setop);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  (*pLVar5->_vptr_LogicalOperator[2])(local_60 + 0x18,pLVar5);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  (*pLVar5->_vptr_LogicalOperator[2])(local_60,pLVar5);
  if (node_ptr[0xe].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    this_05 = &(setop->super_LogicalOperator).children.
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    __n = (element_type *)0x0;
    do {
      pvVar6 = vector<duckdb::ColumnBinding,_true>::operator[]
                         ((vector<duckdb::ColumnBinding,_true> *)(local_60 + 0x18),(size_type)__n);
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_05,pvVar6);
      pvVar6 = vector<duckdb::ColumnBinding,_true>::operator[]
                         ((vector<duckdb::ColumnBinding,_true> *)local_60,(size_type)__n);
      iVar8 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_05,pvVar6);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0 &&
          iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_a0._M_head_impl = (BaseStatistics *)0x0;
        cVar1 = *(char *)&node_ptr[1].
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        if (cVar1 == 'M') {
          unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
          operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)((long)iVar7.
                               super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                               ._M_cur + 0x18));
          BaseStatistics::ToUnique((BaseStatistics *)local_88);
LAB_00d4dafd:
          uVar3 = local_88._0_8_;
          _Var2._M_head_impl = local_a0._M_head_impl;
          local_88._0_8_ = (LogicalOperator *)0x0;
          local_a0._M_head_impl = (BaseStatistics *)uVar3;
          if (_Var2._M_head_impl != (BaseStatistics *)0x0) {
            BaseStatistics::~BaseStatistics(_Var2._M_head_impl);
            operator_delete(_Var2._M_head_impl);
          }
          uVar3 = local_88._0_8_;
          if ((LogicalOperator *)local_88._0_8_ != (LogicalOperator *)0x0) {
            BaseStatistics::~BaseStatistics((BaseStatistics *)local_88._0_8_);
            operator_delete((void *)uVar3);
          }
        }
        else {
          if (cVar1 == 'L') {
            unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                        *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                 ._M_cur + 0x18));
            BaseStatistics::ToUnique((BaseStatistics *)local_88);
            goto LAB_00d4dafd;
          }
          if (cVar1 != 'K') {
            this_03 = (InternalException *)__cxa_allocate_exception(0x10);
            local_88._0_8_ = local_88 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"Unsupported setop type","");
            InternalException::InternalException(this_03,(string *)local_88);
            __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
          operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)((long)iVar7.
                               super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                               ._M_cur + 0x18));
          BaseStatistics::ToUnique((BaseStatistics *)local_88);
          uVar3 = local_88._0_8_;
          _Var2._M_head_impl = local_a0._M_head_impl;
          local_88._0_8_ = (LogicalOperator *)0x0;
          local_a0._M_head_impl = (BaseStatistics *)uVar3;
          if (_Var2._M_head_impl != (BaseStatistics *)0x0) {
            BaseStatistics::~BaseStatistics(_Var2._M_head_impl);
            operator_delete(_Var2._M_head_impl);
          }
          uVar3 = local_88._0_8_;
          if ((LogicalOperator *)local_88._0_8_ != (LogicalOperator *)0x0) {
            BaseStatistics::~BaseStatistics((BaseStatistics *)local_88._0_8_);
            operator_delete((void *)uVar3);
          }
          this_01 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                  *)&local_a0);
          other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)((long)iVar8.
                                        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                        ._M_cur + 0x18));
          BaseStatistics::Merge(this_01,other);
        }
        local_88._0_8_ =
             node_ptr[0xd].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        local_88._8_8_ = __n;
        this_02 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)::std::__detail::
                     _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_05,(key_type *)local_88);
        _Var2._M_head_impl = local_a0._M_head_impl;
        local_a0._M_head_impl = (BaseStatistics *)0x0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset(this_02,_Var2._M_head_impl);
        _Var2._M_head_impl = local_a0._M_head_impl;
        if (local_a0._M_head_impl != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics(local_a0._M_head_impl);
          operator_delete(_Var2._M_head_impl);
        }
      }
      __n = (element_type *)((long)&__n->_vptr_ExtraTypeInfo + 1);
    } while (__n < node_ptr[0xe].
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  }
  if (((Optimizer *)local_98._0_8_ == (Optimizer *)0x0) ||
     ((ClientContext *)local_98._8_8_ == (ClientContext *)0x0)) {
    *(Optimizer **)local_88._32_8_ = (Optimizer *)0x0;
  }
  else {
    if (*(char *)&node_ptr[1].
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == 'K') {
      this_04 = (StatisticsPropagator *)(local_98 + 8);
      new_stats_00 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                     ::operator*((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                  *)this_04);
      AddCardinalities(this_04,(unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                *)local_98,new_stats_00);
    }
    *(Optimizer **)local_88._32_8_ = (Optimizer *)local_98._0_8_;
    local_98._0_8_ =
         (__uniq_ptr_data<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true,_true>
          )0x0;
  }
  uVar3 = local_88._32_8_;
  if ((data_t  [8])local_60._0_8_ != (data_t  [8])0x0) {
    operator_delete((void *)local_60._0_8_);
  }
  if ((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
      local_60._24_8_ !=
      (__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)0x0) {
    operator_delete((void *)local_60._24_8_);
  }
  if ((ClientContext *)local_98._8_8_ != (ClientContext *)0x0) {
    operator_delete((void *)local_98._8_8_);
  }
  if ((Optimizer *)local_98._0_8_ != (Optimizer *)0x0) {
    operator_delete((void *)local_98._0_8_);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)uVar3;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalSetOperation &setop,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate statistics in the child nodes
	auto left_stats = PropagateStatistics(setop.children[0]);
	auto right_stats = PropagateStatistics(setop.children[1]);

	// now fetch the column bindings on both sides
	auto left_bindings = setop.children[0]->GetColumnBindings();
	auto right_bindings = setop.children[1]->GetColumnBindings();

	D_ASSERT(left_bindings.size() == right_bindings.size());
	D_ASSERT(left_bindings.size() == setop.column_count);
	for (idx_t i = 0; i < setop.column_count; i++) {
		// for each column binding, we fetch the statistics from both the lhs and the rhs
		auto left_entry = statistics_map.find(left_bindings[i]);
		auto right_entry = statistics_map.find(right_bindings[i]);
		if (left_entry == statistics_map.end() || right_entry == statistics_map.end()) {
			// no statistics on one of the sides: can't propagate stats
			continue;
		}
		unique_ptr<BaseStatistics> new_stats;
		switch (setop.type) {
		case LogicalOperatorType::LOGICAL_UNION:
			// union: merge the stats of the LHS and RHS together
			new_stats = left_entry->second->ToUnique();
			new_stats->Merge(*right_entry->second);
			break;
		case LogicalOperatorType::LOGICAL_EXCEPT:
			// except: use the stats of the LHS
			new_stats = left_entry->second->ToUnique();
			break;
		case LogicalOperatorType::LOGICAL_INTERSECT:
			// intersect: intersect the two stats
			// FIXME: for now we just use the stats of the LHS, as this is correct
			// however, the stats can be further refined to the minimal subset of the LHS and RHS
			new_stats = left_entry->second->ToUnique();
			break;
		default:
			throw InternalException("Unsupported setop type");
		}
		ColumnBinding binding(setop.table_index, i);
		statistics_map[binding] = std::move(new_stats);
	}
	if (!left_stats || !right_stats) {
		return nullptr;
	}
	if (setop.type == LogicalOperatorType::LOGICAL_UNION) {
		AddCardinalities(left_stats, *right_stats);
	}
	return left_stats;
}